

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

iterator __thiscall
GF2::MI<137ul,GF2::MOGrlex<137ul>>::Insert<137ul,GF2::MOGrlex<137ul>>
          (MI<137UL,_GF2::MOGrlex<137UL>_> *this,MP<137UL,_GF2::MOGrlex<137UL>_> *polyRight)

{
  bool bVar1;
  MOGrlex<137UL> *in_RSI;
  iterator *in_stack_00000038;
  MP<137UL,_GF2::MOGrlex<137UL>_> *in_stack_00000040;
  MI<137UL,_GF2::MOGrlex<137UL>_> *in_stack_00000048;
  iterator pos;
  MP<137UL,_GF2::MOGrlex<137UL>_> *this_00;
  const_iterator in_stack_ffffffffffffff98;
  MP<137UL,_GF2::MOGrlex<137UL>_> local_48;
  _List_const_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_> local_28;
  _List_node_base *local_20;
  MOGrlex<137UL> *local_18;
  _List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_> local_8;
  
  local_18 = in_RSI;
  std::_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>::_List_iterator(&local_8);
  bVar1 = MI<137UL,_GF2::MOGrlex<137UL>_>::Find
                    (in_stack_00000048,in_stack_00000040,in_stack_00000038);
  if (!bVar1) {
    std::_List_const_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>::_List_const_iterator
              (&local_28,&local_8);
    this_00 = &local_48;
    MP<137UL,_GF2::MOGrlex<137UL>_>::MP(this_00,local_18);
    local_20 = (_List_node_base *)
               std::__cxx11::
               list<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
               ::insert((list<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                         *)this_00,in_stack_ffffffffffffff98,(value_type *)local_18);
    local_8._M_node = local_20;
    std::_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>::operator*
              ((_List_iterator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_> *)0x186d77);
    MP<137UL,_GF2::MOGrlex<137UL>_>::operator=(this_00,(MP<137UL,_GF2::MOGrlex<137UL>_> *)local_18);
    MP<137UL,_GF2::MOGrlex<137UL>_>::~MP((MP<137UL,_GF2::MOGrlex<137UL>_> *)0x186d8f);
  }
  return (iterator)local_8._M_node;
}

Assistant:

iterator Insert(const MP<_m, _O1>& polyRight)
	{	
		assert(!polyRight.IsEmpty());
		iterator pos;
		if (!Find(polyRight, pos))
			*(pos = insert(pos, MP<_n, _O>(_order))) = polyRight;
		return pos;
	}